

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O1

int refs_modify(refs_table_t *tbl,uint64_t a,int dir)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  uint32_t uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong *puVar9;
  int iVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  
  uVar7 = ((a >> 0x27 | a << 0x19) ^ (a ^ 0xcbf29ce484222325) * 0x100000001b3) * 0x100000001b3;
  uVar13 = a | 0x10000000000;
LAB_00128b92:
  do {
    while (uVar3 = tbl->refs_control, 0xfffffff < uVar3) {
      do {
        iVar10 = refs_resize_help(tbl);
      } while (iVar10 != 0);
    }
    LOCK();
    bVar14 = uVar3 == tbl->refs_control;
    if (bVar14) {
      tbl->refs_control = uVar3 + 1;
    }
    UNLOCK();
  } while (!bVar14);
  do {
    puVar9 = tbl->refs_table + (tbl->refs_size - 1 & (uVar7 >> 0x20 ^ uVar7));
    iVar10 = 0x7f;
    puVar8 = (ulong *)0x0;
    uVar12 = uVar13;
    do {
      while (uVar5 = *puVar9, uVar5 == 0) {
        if (dir < 0) goto LAB_00128caa;
        uVar5 = 0x7fffffffffffffff;
        if (puVar8 == (ulong *)0x0) {
          uVar5 = 0;
          puVar8 = puVar9;
        }
        iVar6 = 0;
        puVar11 = (ulong *)0x0;
        puVar9 = puVar8;
        uVar12 = uVar13;
LAB_00128c54:
        LOCK();
        uVar2 = *puVar9;
        if (uVar5 == uVar2) {
          *puVar9 = uVar12;
        }
        UNLOCK();
        puVar8 = puVar11;
        if (uVar5 == uVar2) goto LAB_00128cac;
      }
      if (uVar5 == 0x7fffffffffffffff) {
        if (puVar8 == (ulong *)0x0) {
          puVar8 = puVar9;
        }
      }
      else if ((uVar5 & 0xffffffffff) == a) {
        if ((uVar5 >> 0x28 != 0x7fffff) &&
           (lVar1 = (uVar5 >> 0x28) + (long)dir, uVar12 = lVar1 << 0x28 | a, lVar1 == 0)) {
          uVar12 = 0x7fffffffffffffff;
        }
        iVar6 = 1;
        puVar11 = puVar8;
        if ((uint)(uVar5 >> 0x28) != 0x7fffff) goto LAB_00128c54;
        goto LAB_00128cac;
      }
      puVar9 = puVar9 + 1;
      if (puVar9 == tbl->refs_table + tbl->refs_size) {
        puVar9 = tbl->refs_table;
      }
      bVar14 = iVar10 != 0;
      iVar10 = iVar10 + -1;
    } while (bVar14);
    if (dir < 0) {
LAB_00128caa:
      iVar6 = 0;
LAB_00128cac:
      do {
        uVar4 = tbl->refs_control;
        LOCK();
        bVar14 = uVar4 == tbl->refs_control;
        if (bVar14) {
          tbl->refs_control = uVar4 - 1;
        }
        UNLOCK();
      } while (!bVar14);
      return iVar6;
    }
    if (puVar8 == (ulong *)0x0) break;
    LOCK();
    uVar12 = *puVar8;
    if (uVar12 == 0x7fffffffffffffff) {
      *puVar8 = uVar13;
    }
    UNLOCK();
    if (uVar12 == 0x7fffffffffffffff) {
      iVar6 = 1;
      goto LAB_00128cac;
    }
  } while( true );
  do {
    uVar4 = tbl->refs_control;
    LOCK();
    bVar14 = uVar4 == tbl->refs_control;
    if (bVar14) {
      tbl->refs_control = uVar4 - 1;
    }
    UNLOCK();
  } while (!bVar14);
  refs_resize(tbl);
  goto LAB_00128b92;
}

Assistant:

static inline int
refs_modify(refs_table_t *tbl, const uint64_t a, const int dir)
{
    _Atomic(uint64_t)* bucket;
    _Atomic(uint64_t)* ts_bucket;
    uint64_t v, new_v;
    int res, i;

    refs_enter(tbl);

ref_retry:
    bucket = tbl->refs_table + (fnvhash8(a) & (tbl->refs_size - 1));
    ts_bucket = NULL; // tombstone
    i = 128; // try 128 times linear probing

    while (i--) {
ref_restart:
        v = *bucket;
        if (v == refs_ts) {
            if (ts_bucket == NULL) ts_bucket = bucket;
        } else if (v == 0) {
            // not found
            res = 0;
            if (dir < 0) goto ref_exit;
            if (ts_bucket != NULL) {
                bucket = ts_bucket;
                ts_bucket = NULL;
                v = refs_ts;
            }
            new_v = a | (1ULL << 40);
            goto ref_mod;
        } else if ((v & 0x000000ffffffffff) == a) {
            // found
            res = 1;
            uint64_t count = v >> 40;
            if (count == 0x7fffff) goto ref_exit;
            count += dir;
            if (count == 0) new_v = refs_ts;
            else new_v = a | (count << 40);
            goto ref_mod;
        }

        if (++bucket == tbl->refs_table + tbl->refs_size) bucket = tbl->refs_table;
    }

    // not found after linear probing
    if (dir < 0) {
        res = 0;
        goto ref_exit;
    } else if (ts_bucket != NULL) {
        bucket = ts_bucket;
        ts_bucket = NULL;
        v = refs_ts;
        new_v = a | (1ULL << 40);
        if (!atomic_compare_exchange_weak(bucket, &v, new_v)) goto ref_retry;
        res = 1;
        goto ref_exit;
    } else {
        // hash table full
        refs_leave(tbl);
        refs_resize(tbl);
        return refs_modify(tbl, a, dir);
    }

ref_mod:
    if (!atomic_compare_exchange_weak(bucket, &v, new_v)) goto ref_restart;

ref_exit:
    refs_leave(tbl);
    return res;
}